

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

Type __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
AddMember<VkVertexInputRate>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,StringRefType *name,VkVertexInputRate value,
          MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Type pGVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> n;
  Data local_18;
  
  local_18.s.str = (Ch *)((ulong)name->s | 0x405000000000000);
  local_18.s.hashcode = 0;
  local_18.s.length = name->length;
  pGVar1 = AddMember<VkVertexInputRate>
                     (this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&local_18.s,value,allocator);
  return pGVar1;
}

Assistant:

AddMember(StringRefType name, T value, Allocator& allocator) {
        GenericValue n(name);
        return AddMember(n, value, allocator);
    }